

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

TString * user_defined_type_name(LexState *ls,TString *typename)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  TString *pTVar4;
  size_t sVar5;
  char buffer [128];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  if ((ls->t).token != 0x2e) {
    return typename;
  }
  luaX_next(ls);
  local_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  uStack_38 = 0;
  uStack_30 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  uStack_78 = 0;
  uStack_70 = 0;
  uVar3 = strlen((char *)(typename + 1));
  if (uVar3 < 0x80) {
    snprintf((char *)&local_a8,0x80,"%s",typename + 1);
    pTVar4 = str_checkname(ls);
    pTVar4 = pTVar4 + 1;
    sVar5 = strlen((char *)pTVar4);
    uVar2 = uVar3 + 1 + sVar5;
    while (uVar1 = uVar2, uVar1 < 0x80) {
      snprintf((char *)((long)&local_a8 + uVar3),0x80 - uVar3,".%s",pTVar4);
      if ((ls->t).token != 0x2e) {
        sVar5 = strlen((char *)&local_a8);
        pTVar4 = luaX_newstring(ls,(char *)&local_a8,sVar5);
        return pTVar4;
      }
      luaX_next(ls);
      pTVar4 = str_checkname(ls);
      pTVar4 = pTVar4 + 1;
      sVar5 = strlen((char *)pTVar4);
      uVar3 = uVar1;
      uVar2 = uVar1 + 1 + sVar5;
    }
  }
  luaX_syntaxerror(ls,"User defined type name is too long");
}

Assistant:

static TString *user_defined_type_name(LexState *ls, TString *typename) {
  size_t len = 0;
  if (testnext(ls, '.')) {
    char buffer[128] = {0};
    const char *str = getstr(typename);
    len = strlen(str);
    if (len >= sizeof buffer) {
      luaX_syntaxerror(ls, "User defined type name is too long");
      return typename;
    }
    snprintf(buffer, sizeof buffer, "%s", str);
    do {
      typename = str_checkname(ls);
      str = getstr(typename);
      size_t newlen = len + strlen(str) + 1;
      if (newlen >= sizeof buffer) {
        luaX_syntaxerror(ls, "User defined type name is too long");
        return typename;
      }
      snprintf(buffer + len, sizeof buffer - len, ".%s", str);
      len = newlen;
    } while (testnext(ls, '.'));
    typename = luaX_newstring(ls, buffer, strlen(buffer));
  }
  return typename;
}